

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O1

string * __thiscall
duckdb::PhysicalCopyToFile::GetTrimmedPath_abi_cxx11_
          (string *__return_storage_ptr__,PhysicalCopyToFile *this,ClientContext *context)

{
  pointer pcVar1;
  FileSystem *pFVar2;
  string local_40;
  
  pFVar2 = FileSystem::GetFileSystem(context);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->file_path)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->file_path)._M_string_length);
  (*pFVar2->_vptr_FileSystem[0x18])(&local_40,pFVar2,__return_storage_ptr__);
  StringUtil::RTrim(__return_storage_ptr__,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string PhysicalCopyToFile::GetTrimmedPath(ClientContext &context) const {
	auto &fs = FileSystem::GetFileSystem(context);
	string trimmed_path = file_path;
	StringUtil::RTrim(trimmed_path, fs.PathSeparator(trimmed_path));
	return trimmed_path;
}